

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O2

uint Assimp::strtoul10(char *in,char **out)

{
  uint uVar1;
  
  uVar1 = 0;
  while( true ) {
    if ((byte)(*in - 0x3aU) < 0xf6) break;
    uVar1 = (uint)(byte)(*in - 0x30) + uVar1 * 10;
    in = in + 1;
  }
  if (out != (char **)0x0) {
    *out = in;
  }
  return uVar1;
}

Assistant:

inline
unsigned int strtoul10( const char* in, const char** out=0) {
    unsigned int value = 0;

    for ( ;; ) {
        if ( *in < '0' || *in > '9' ) {
            break;
        }

        value = ( value * 10 ) + ( *in - '0' );
        ++in;
    }
    if ( out ) {
        *out = in;
    }
    return value;
}